

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_test_registry.hpp
# Opt level: O3

void __thiscall
Catch::
TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_174<slang::SmallVector<std::pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable>,_3UL>_>_>
::invoke(TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_174<slang::SmallVector<std::pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable>,_3UL>_>_>
         *this)

{
  code *pcVar1;
  char *pcVar2;
  int iVar3;
  EVP_PKEY_CTX *ctx;
  CATCH2_INTERNAL_TEMPLATE_TEST_174<slang::SmallVector<std::pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable>,_3UL>_>
  obj;
  int local_78;
  int local_74;
  SmallVectorBase<std::pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable>_>
  local_70;
  
  ::(anonymous_namespace)::Constructable::numConstructorCalls = 0;
  ::(anonymous_namespace)::Constructable::numMoveConstructorCalls = 0;
  ::(anonymous_namespace)::Constructable::numCopyConstructorCalls = 0;
  ::(anonymous_namespace)::Constructable::numDestructorCalls = 0;
  ::(anonymous_namespace)::Constructable::numAssignmentCalls = 0;
  ::(anonymous_namespace)::Constructable::numMoveAssignmentCalls = 0;
  ::(anonymous_namespace)::Constructable::numCopyAssignmentCalls = 0;
  local_70.data_ = (pointer)local_70.firstElement;
  local_70.len = 0;
  local_70.cap = 3;
  iVar3 = 1;
  do {
    ctx = (EVP_PKEY_CTX *)&local_74;
    local_78 = iVar3;
    local_74 = iVar3;
    slang::
    SmallVectorBase<std::pair<(anonymous_namespace)::Constructable,(anonymous_namespace)::Constructable>>
    ::emplace_back<int,int>
              ((SmallVectorBase<std::pair<(anonymous_namespace)::Constructable,(anonymous_namespace)::Constructable>>
                *)&local_70,&local_74,&local_78);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 4);
  pcVar1 = (code *)this->m_testAsMethod;
  pcVar2 = local_70.firstElement + *(long *)&this->field_0x10 + -0x18;
  if (((ulong)pcVar1 & 1) != 0) {
    pcVar1 = *(code **)(pcVar1 + *(long *)pcVar2 + -1);
  }
  (*pcVar1)(pcVar2);
  slang::
  SmallVectorBase<std::pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable>_>
  ::cleanup(&local_70,ctx);
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }